

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbivax_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  CPUState *cpu;
  CPUState *cs;
  target_ulong address_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu = env_cpu(env);
  if ((address & 4) == 0) {
    if ((address & 8) == 0) {
      booke206_invalidate_ea_tlb(env,0,(uint32_t)address);
      tlb_flush_page_ppc64(cpu,address & 0xfffffffffffff000);
    }
    else {
      booke206_invalidate_ea_tlb(env,1,(uint32_t)address);
      tlb_flush_ppc64(cpu);
    }
  }
  else if ((address & 8) == 0) {
    booke206_flush_tlb(env,1,0);
  }
  else {
    booke206_flush_tlb(env,2,1);
  }
  return;
}

Assistant:

void helper_booke206_tlbivax(CPUPPCState *env, target_ulong address)
{
    CPUState *cs = env_cpu(env);

    if (address & 0x4) {
        /* flush all entries */
        if (address & 0x8) {
            /* flush all of TLB1 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB1, 1);
        } else {
            /* flush all of TLB0 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB0, 0);
        }
        return;
    }

    if (address & 0x8) {
        /* flush TLB1 entries */
        booke206_invalidate_ea_tlb(env, 1, address);
        tlb_flush(cs);
    } else {
        /* flush TLB0 entries */
        booke206_invalidate_ea_tlb(env, 0, address);
        tlb_flush_page(cs, address & MAS2_EPN_MASK);
    }
}